

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStr.c
# Opt level: O3

int Str_MuxToGia_rec(Gia_Man_t *pNew,Str_Mux_t *pMux,int i,Vec_Int_t *vDelay)

{
  Str_Mux_t *pMux_00;
  int iVar1;
  int iLit0;
  int iLit1;
  uint uVar2;
  long lVar3;
  
  lVar3 = (long)pMux->Edge[i].Fan;
  if (0 < lVar3) {
    iVar1 = pMux->Id;
    pMux_00 = pMux + (lVar3 - iVar1);
    iLit0 = Str_MuxToGia_rec(pNew,pMux_00,0,vDelay);
    iLit1 = Str_MuxToGia_rec(pNew,pMux_00,1,vDelay);
    if (0 < pMux[lVar3 - iVar1].Edge[2].Fan) {
      __assert_fail("pFanin->Edge[2].Fan <= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaStr.c"
                    ,0x5fd,"int Str_MuxToGia_rec(Gia_Man_t *, Str_Mux_t *, int, Vec_Int_t *)");
    }
    if (pMux_00->Edge[2].fCompl != 0) {
      __assert_fail("pFanin->Edge[2].fCompl == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaStr.c"
                    ,0x5fe,"int Str_MuxToGia_rec(Gia_Man_t *, Str_Mux_t *, int, Vec_Int_t *)");
    }
    uVar2 = Gia_ManHashMuxReal(pNew,pMux_00->Edge[2].Copy,iLit1,iLit0);
    pMux->Edge[i].Copy = uVar2;
    if ((int)uVar2 < 0) {
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                    ,0x12f,"int Abc_Lit2Var(int)");
    }
    Str_ObjDelay(pNew,uVar2 >> 1,pMux_00->nLutSize,vDelay);
  }
  uVar2 = pMux->Edge[i].Copy;
  if (-1 < (int)uVar2) {
    return uVar2 ^ 0 < pMux->Edge[i].fCompl;
  }
  __assert_fail("Lit >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                ,0x132,"int Abc_LitNotCond(int, int)");
}

Assistant:

int Str_MuxToGia_rec( Gia_Man_t * pNew, Str_Mux_t * pMux, int i, Vec_Int_t * vDelay )
{
    if ( pMux->Edge[i].Fan > 0 )
    {
        Str_Mux_t * pFanin = Str_MuxFanin( pMux, i );
        int iLit0 = Str_MuxToGia_rec( pNew, pFanin, 0, vDelay );
        int iLit1 = Str_MuxToGia_rec( pNew, pFanin, 1, vDelay );
        assert( pFanin->Edge[2].Fan <= 0 );
        assert( pFanin->Edge[2].fCompl == 0 );
        pMux->Edge[i].Copy = Gia_ManHashMuxReal( pNew, pFanin->Edge[2].Copy, iLit1, iLit0 );
        Str_ObjDelay( pNew, Abc_Lit2Var(pMux->Edge[i].Copy), pFanin->nLutSize, vDelay );
    }
    return Abc_LitNotCond( pMux->Edge[i].Copy, pMux->Edge[i].fCompl );
}